

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsKeyReleased(int user_key_index)

{
  if (-1 < user_key_index) {
    if (0x1ff < (uint)user_key_index) {
      __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x1258,"bool ImGui::IsKeyReleased(int)");
    }
    if (0.0 <= (GImGui->IO).KeysDownDurationPrev[(uint)user_key_index]) {
      return (bool)((GImGui->IO).KeysDown[(uint)user_key_index] ^ 1);
    }
  }
  return false;
}

Assistant:

bool ImGui::IsKeyReleased(int user_key_index)
{
    ImGuiContext& g = *GImGui;
    if (user_key_index < 0) return false;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    return g.IO.KeysDownDurationPrev[user_key_index] >= 0.0f && !g.IO.KeysDown[user_key_index];
}